

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O1

RK_S32 mastering_display_colour_volume(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  long lVar2;
  RK_S32 RVar3;
  RK_S32 _out;
  RK_U32 lum;
  ulong local_38;
  
  lum = 0;
  lVar2 = 0;
  while( true ) {
    MVar1 = mpp_read_bits(gb,0x10,&_out);
    gb->ret = MVar1;
    RVar3 = -0x3ec;
    if (MVar1 != MPP_OK) {
      return -0x3ec;
    }
    (s->mastering_display).display_primaries[lVar2][0] = (RK_U16)_out;
    MVar1 = mpp_read_bits(gb,0x10,&_out);
    gb->ret = MVar1;
    if (MVar1 != MPP_OK) break;
    (s->mastering_display).display_primaries[lVar2][1] = (RK_U16)_out;
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      MVar1 = mpp_read_bits(gb,0x10,&_out);
      gb->ret = MVar1;
      if (MVar1 == MPP_OK) {
        (s->mastering_display).white_point[0] = (RK_U16)_out;
        MVar1 = mpp_read_bits(gb,0x10,&_out);
        gb->ret = MVar1;
        if (MVar1 == MPP_OK) {
          (s->mastering_display).white_point[1] = (RK_U16)_out;
          mpp_read_longbits(gb,0x20,&lum);
          (s->mastering_display).max_luminance = lum;
          mpp_read_longbits(gb,0x20,&lum);
          (s->mastering_display).min_luminance = lum;
          RVar3 = 0;
          if (((byte)h265d_debug & 0x20) != 0) {
            local_38 = (ulong)(s->mastering_display).display_primaries[1][0];
            RVar3 = 0;
            _mpp_log_l(4,"h265d_sei",
                       "dis_prim [%d %d] [%d %d] [%d %d] white point %d %d luminance %d %d\n",
                       (char *)0x0,(ulong)(s->mastering_display).display_primaries[0][0],
                       (ulong)(s->mastering_display).display_primaries[0][1],local_38,
                       (ulong)(s->mastering_display).display_primaries[1][1],
                       (ulong)(s->mastering_display).display_primaries[2][0],
                       (ulong)(s->mastering_display).display_primaries[2][1],
                       (ulong)(s->mastering_display).white_point[0],
                       (ulong)(s->mastering_display).white_point[1],
                       (ulong)(s->mastering_display).max_luminance,(ulong)lum);
          }
        }
      }
      return RVar3;
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 mastering_display_colour_volume(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 i = 0;
    RK_U16 value = 0;
    RK_U32 lum = 0;

    for (i = 0; i < 3; i++) {
        READ_BITS(gb, 16, &value);
        s->mastering_display.display_primaries[i][0] = value;
        READ_BITS(gb, 16, &value);
        s->mastering_display.display_primaries[i][1] = value;
    }
    READ_BITS(gb, 16, &value);
    s->mastering_display.white_point[0] = value;
    READ_BITS(gb, 16, &value);
    s->mastering_display.white_point[1] = value;
    mpp_read_longbits(gb, 32, &lum);
    s->mastering_display.max_luminance = lum;
    mpp_read_longbits(gb, 32, &lum);
    s->mastering_display.min_luminance = lum;

    h265d_dbg(H265D_DBG_SEI, "dis_prim [%d %d] [%d %d] [%d %d] white point %d %d luminance %d %d\n",
              s->mastering_display.display_primaries[0][0],
              s->mastering_display.display_primaries[0][1],
              s->mastering_display.display_primaries[1][0],
              s->mastering_display.display_primaries[1][1],
              s->mastering_display.display_primaries[2][0],
              s->mastering_display.display_primaries[2][1],
              s->mastering_display.white_point[0],
              s->mastering_display.white_point[1],
              s->mastering_display.max_luminance,
              s->mastering_display.min_luminance);

    return 0;

__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}